

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

int xm_check_sanity_preload(char *module,size_t module_length)

{
  int iVar1;
  ulong in_RSI;
  void *in_RDI;
  int local_4;
  
  if (in_RSI < 0x3c) {
    local_4 = 4;
  }
  else {
    iVar1 = memcmp("Extended Module: ",in_RDI,0x11);
    if (iVar1 == 0) {
      if (*(char *)((long)in_RDI + 0x25) == '\x1a') {
        if ((*(char *)((long)in_RDI + 0x3b) == '\x01') && (*(char *)((long)in_RDI + 0x3a) == '\x04')
           ) {
          local_4 = 0;
        }
        else {
          local_4 = 3;
        }
      }
      else {
        local_4 = 2;
      }
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int xm_check_sanity_preload(const char* module, size_t module_length) {
	if(module_length < 60) {
		return 4;
	}

	if(memcmp("Extended Module: ", module, 17) != 0) {
		return 1;
	}

	if(module[37] != 0x1A) {
		return 2;
	}

	if(module[59] != 0x01 || module[58] != 0x04) {
		/* Not XM 1.04 */
		return 3;
	}

	return 0;
}